

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall QtPrivate::QPodArrayOps<char>::erase(QPodArrayOps<char> *this,char *b,qsizetype n)

{
  char *__src;
  QArrayDataPointer<char> *pQVar1;
  char *pcVar2;
  long in_RDX;
  QArrayDataPointer<char> *in_RSI;
  long in_RDI;
  char *e;
  QArrayDataPointer<char> *in_stack_ffffffffffffffb0;
  
  __src = (char *)((long)&in_RSI->d + in_RDX);
  pQVar1 = (QArrayDataPointer<char> *)
           QArrayDataPointer<char>::begin((QArrayDataPointer<char> *)0x4bd1cf);
  if ((in_RSI == pQVar1) &&
     (pcVar2 = QArrayDataPointer<char>::end(in_stack_ffffffffffffffb0), __src != pcVar2)) {
    *(char **)(in_RDI + 8) = __src;
  }
  else {
    pcVar2 = QArrayDataPointer<char>::end(in_stack_ffffffffffffffb0);
    if (__src != pcVar2) {
      pcVar2 = QArrayDataPointer<char>::end(in_RSI);
      memmove(in_RSI,__src,(long)pcVar2 - (long)__src);
    }
  }
  *(long *)(in_RDI + 0x10) = *(long *)(in_RDI + 0x10) - in_RDX;
  return;
}

Assistant:

void erase(T *b, qsizetype n)
    {
        T *e = b + n;
        Q_ASSERT(this->isMutable());
        Q_ASSERT(b < e);
        Q_ASSERT(b >= this->begin() && b < this->end());
        Q_ASSERT(e > this->begin() && e <= this->end());

        // Comply with std::vector::erase(): erased elements and all after them
        // are invalidated. However, erasing from the beginning effectively
        // means that all iterators are invalidated. We can use this freedom to
        // erase by moving towards the end.
        if (b == this->begin() && e != this->end()) {
            this->ptr = e;
        } else if (e != this->end()) {
            ::memmove(static_cast<void *>(b), static_cast<void *>(e),
                      (static_cast<T *>(this->end()) - e) * sizeof(T));
        }
        this->size -= n;
    }